

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSop(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nCubeLimit;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  int local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  nCubeLimit = 1000000;
  local_3c = -1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Cdnh"), iVar2 = globalUtilOptind, iVar1 != 0x43) {
      if (iVar1 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else {
          if (pNtk->ntkType == ABC_NTK_LOGIC) {
            iVar2 = Abc_NtkToSop(pNtk,local_3c,nCubeLimit);
            if (iVar2 != 0) {
              return 0;
            }
            Abc_Print(-1,"Converting to SOP has failed.\n");
            return 0;
          }
          pcVar3 = "Converting to SOP is possible only for logic networks.\n";
        }
        iVar2 = -1;
        goto LAB_001f01d1;
      }
      if (iVar1 == 100) {
        local_3c = 1;
      }
      else {
        if (iVar1 != 0x6e) goto LAB_001f0147;
        local_3c = 0;
      }
    }
    if (argc <= globalUtilOptind) break;
    nCubeLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nCubeLimit < 0) {
LAB_001f0147:
      iVar2 = -2;
      Abc_Print(-2,"usage: sop [-C num] [-dnh]\n");
      Abc_Print(-2,"\t         converts node functions to SOP\n");
      Abc_Print(-2,"\t-C num : the limit on the number of cubes at a node [default = %d]\n",
                (ulong)nCubeLimit);
      pcVar4 = "no";
      pcVar3 = "no";
      if (local_3c == 1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggles using only positive polarity [default = %s]\n",pcVar3);
      if (local_3c == 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggles using only negative polarity [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_001f01d1:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_001f0147;
}

Assistant:

int Abc_CommandSop( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fMode = -1, nCubeLimit = 1000000;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cdnh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLimit < 0 )
                goto usage;
            break;
        case 'd':
            fMode = 1;
            break;
        case 'n':
            fMode = 0;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Converting to SOP is possible only for logic networks.\n" );
        return 1;
    }
    if ( !Abc_NtkToSop(pNtk, fMode, nCubeLimit) )
    {
        Abc_Print( -1, "Converting to SOP has failed.\n" );
        return 0;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: sop [-C num] [-dnh]\n" );
    Abc_Print( -2, "\t         converts node functions to SOP\n" );
    Abc_Print( -2, "\t-C num : the limit on the number of cubes at a node [default = %d]\n", nCubeLimit );
    Abc_Print( -2, "\t-d     : toggles using only positive polarity [default = %s]\n", fMode == 1 ? "yes": "no"  );
    Abc_Print( -2, "\t-n     : toggles using only negative polarity [default = %s]\n", fMode == 0 ? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}